

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

sxu32 SyBlobFormatAp(SyBlob *pBlob,char *zFormat,__va_list_tag *ap)

{
  sxu32 n;
  
  n = 0;
  FormatMount(6,pBlob,(ProcConsumer)0x0,(void *)0x0,&n,zFormat,ap);
  return n;
}

Assistant:

JX9_PRIVATE sxu32 SyBlobFormatAp(SyBlob *pBlob, const char *zFormat, va_list ap)
{
	sxu32 n = 0; /* cc warning */
#if defined(UNTRUST)	
	if( SX_EMPTY_STR(zFormat) ){
		return 0;
	}
#endif	
	FormatMount(SXFMT_CONS_BLOB, &(*pBlob), 0, 0, &n, zFormat, ap);
	return n;
}